

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcore_unix_p.h
# Opt level: O2

int qt_safe_open(char *pathname,int flags,mode_t mode)

{
  int iVar1;
  int *piVar2;
  
  do {
    iVar1 = open64(pathname,flags | 0x80000,(ulong)mode);
    if (iVar1 != -1) {
      return iVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return -1;
}

Assistant:

static inline int qt_safe_open(const char *pathname, int flags, mode_t mode = 0777)
{
#ifdef O_CLOEXEC
    flags |= O_CLOEXEC;
#endif
    int fd;
    QT_EINTR_LOOP(fd, QT_OPEN(pathname, flags, mode));

#ifndef O_CLOEXEC
    if (fd != -1)
        ::fcntl(fd, F_SETFD, FD_CLOEXEC);
#endif

    return fd;
}